

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall CTxMemPool::CTxMemPool(CTxMemPool *this,Options opts,bilingual_str *error)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  int64_t iVar3;
  int iVar4;
  Options *pOVar5;
  Options *pOVar6;
  long lVar7;
  long in_FS_OFFSET;
  byte bVar8;
  double local_c0;
  bilingual_str local_b8;
  bilingual_str local_78;
  long local_38;
  
  bVar8 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->nTransactionsUpdated).super___atomic_base<unsigned_int>._M_i = 0;
  this->totalTxSize = 0;
  this->m_total_fee = 0;
  this->cachedInnerUsage = 0;
  iVar3 = GetTime();
  this->lastRollingFeeUpdate = iVar3;
  this->blockSinceLastRollingFeeBump = false;
  this->rollingMinimumFeeRate = 0.0;
  (this->m_epoch).m_raw_epoch = 0;
  *(undefined8 *)&(this->m_epoch).m_guarded = 0;
  this->m_sequence_number = 1;
  this->m_load_tried = false;
  (this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8)
       = 0;
  (this->cs).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  boost::multi_index::
  multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
  ::multi_index_container(&this->mapTx);
  (this->txns_randomized).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txns_randomized).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txns_randomized).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header;
  (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_unbroadcast_txids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header;
  (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->mapDeltas)._M_t._M_impl.super__Rb_tree_header;
  (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar4 = 1000000;
  if (opts.check_ratio < 1000000) {
    iVar4 = opts.check_ratio;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  opts.check_ratio = iVar4;
  lVar7 = opts.limits.descendant_size_vbytes * 0x28;
  if (SBORROW8(opts.max_size_bytes,lVar7) !=
      opts.max_size_bytes + opts.limits.descendant_size_vbytes * -0x28 < 0 ||
      opts.max_size_bytes < 0) {
    _(&local_b8,(ConstevalStringLiteral)0xce52e1);
    local_c0 = ceil((double)lVar7 / 1000000.0);
    tinyformat::format<double>(&local_78,&local_b8,&local_c0);
    bilingual_str::operator=(error,&local_78);
    bilingual_str::~bilingual_str(&local_78);
    bilingual_str::~bilingual_str(&local_b8);
  }
  pOVar5 = &opts;
  pOVar6 = &this->m_opts;
  for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar2 = *(undefined4 *)&pOVar5->field_0x4;
    pOVar6->check_ratio = pOVar5->check_ratio;
    *(undefined4 *)&pOVar6->field_0x4 = uVar2;
    pOVar5 = (Options *)((long)pOVar5 + (ulong)bVar8 * -0x10 + 8);
    pOVar6 = (Options *)((long)pOVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxMemPool::CTxMemPool(Options opts, bilingual_str& error)
    : m_opts{Flatten(std::move(opts), error)}
{
}